

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

GLenum __thiscall
gl4cts::GPUShaderFP64Test2::getDrawPrimitiveType(GPUShaderFP64Test2 *this,shaderStage shader_stage)

{
  shaderStage shader_stage_local;
  GPUShaderFP64Test2 *this_local;
  
  switch(shader_stage) {
  case FRAGMENT_SHADER:
    this_local._4_4_ = 6;
    break;
  case GEOMETRY_SHADER:
  case VERTEX_SHADER:
    this_local._4_4_ = 0;
    break;
  case TESS_CTRL_SHADER:
  case TESS_EVAL_SHADER:
    this_local._4_4_ = 0xe;
    break;
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

glw::GLenum GPUShaderFP64Test2::getDrawPrimitiveType(shaderStage shader_stage) const
{
	switch (shader_stage)
	{
	case FRAGMENT_SHADER:
		return GL_TRIANGLE_FAN;
		break;

	case GEOMETRY_SHADER:
	case VERTEX_SHADER:
		return GL_POINTS;
		break;

	case TESS_CTRL_SHADER:
	case TESS_EVAL_SHADER:
		return GL_PATCHES;
		break;

	default:
		return GL_NONE;
		break;
	}
}